

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

void QCoreApplication::removeLibraryPath(QString *path)

{
  QStringList *this;
  bool bVar1;
  Type *pTVar2;
  difference_type dVar3;
  QRecursiveMutex *this_00;
  CaseSensitivity in_R8D;
  long in_FS_OFFSET;
  QDeadlineTimer timeout;
  QStringView str;
  QArrayDataPointer<QString> QStack_58;
  QDir local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((path->d).size == 0) goto LAB_0027862e;
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::QDir(&local_40,path);
  QDir::canonicalPath(&local_38,&local_40);
  QDir::~QDir(&local_40);
  if ((QStringList *)local_38.d.size != (QStringList *)0x0) {
    if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>::guard._q_value.
              super___atomic_base<signed_char>._M_i < -1) {
      pTVar2 = (Type *)0x0;
    }
    else {
      pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::
               instance();
    }
    this_00 = &pTVar2->libraryPathMutex;
    timeout.t2 = 0;
    timeout.type = 1;
    timeout.t1 = 0x7fffffffffffffff;
    QRecursiveMutex::tryLock(this_00,timeout);
    this = &pTVar2->manual_libpaths;
    if ((pTVar2->manual_libpaths).d.ptr == (QString *)0x0) {
      libraryPathsLocked();
      QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_58);
      str.m_data = (storage_type_conflict *)0x1;
      str.m_size = (qsizetype)local_38.d.ptr;
      bVar1 = QtPrivate::QStringList_contains
                        ((QtPrivate *)&pTVar2->app_libpaths,(QStringList *)local_38.d.size,str,
                         in_R8D);
      if (bVar1) {
        QArrayDataPointer<QString>::operator=(&this->d,&(pTVar2->app_libpaths).d);
        QtPrivate::sequential_erase_with_copy<QList<QString>,QString>(this,&local_38);
        goto LAB_002785f4;
      }
    }
    else {
      dVar3 = QtPrivate::sequential_erase_with_copy<QList<QString>,QString>(this,&local_38);
      if (dVar3 != 0) {
LAB_002785f4:
        QRecursiveMutex::unlock(this_00);
        QFactoryLoader::refreshAll((QFactoryLoader *)this_00);
        goto LAB_0027860b;
      }
    }
    QRecursiveMutex::unlock(this_00);
  }
LAB_0027860b:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0027862e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCoreApplication::removeLibraryPath(const QString &path)
{
    if (path.isEmpty())
        return;

    QString canonicalPath = QDir(path).canonicalPath();
    if (canonicalPath.isEmpty())
        return;

    QCoreApplicationData *d = coreappdata;
    QMutexLocker locker(&d->libraryPathMutex);

    QStringList *libpaths = &d->manual_libpaths;
    if (d->libPathsManuallySet()) {
        if (libpaths->removeAll(canonicalPath) == 0)
            return;
    } else {
        // make sure that library paths is initialized
        libraryPathsLocked();
        QStringList *app_libpaths = &d->app_libpaths;
        if (!app_libpaths->contains(canonicalPath))
            return;

        *libpaths = *app_libpaths;
        libpaths->removeAll(canonicalPath);
        Q_ASSERT(d->libPathsManuallySet());
    }

    locker.unlock();
    QFactoryLoader::refreshAll();
}